

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataBuffer.cpp
# Opt level: O1

MarkReference * __thiscall DataBuffer::addReference(DataBuffer *this,ByteMark *mark)

{
  iterator *piVar1;
  _Elt_pointer ppMVar2;
  char *pcVar3;
  int iVar4;
  MarkReference *ref;
  MarkReference *local_18;
  
  local_18 = (MarkReference *)operator_new(0x10);
  local_18->target = mark;
  local_18->pos = *(int *)&this->m_position - *(int *)&this->m_buffer;
  ppMVar2 = (this->m_references)._deque.
            super__Deque_base<MarkReference_*,_std::allocator<MarkReference_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppMVar2 ==
      (this->m_references)._deque.
      super__Deque_base<MarkReference_*,_std::allocator<MarkReference_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<MarkReference*,std::allocator<MarkReference*>>::
    _M_push_back_aux<MarkReference*const&>
              ((deque<MarkReference*,std::allocator<MarkReference*>> *)&this->m_references,&local_18
              );
  }
  else {
    *ppMVar2 = local_18;
    piVar1 = &(this->m_references)._deque.
              super__Deque_base<MarkReference_*,_std::allocator<MarkReference_*>_>._M_impl.
              super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  checkSpace(this,4);
  iVar4 = 0;
  do {
    pcVar3 = this->m_position;
    this->m_position = pcVar3 + 1;
    *pcVar3 = (char)(-0x41103502 >> ((byte)iVar4 & 0x1f));
    iVar4 = iVar4 + 8;
  } while (iVar4 != 0x20);
  return local_18;
}

Assistant:

MarkReference* DataBuffer::addReference (ByteMark* mark)
{
	MarkReference* ref = new MarkReference;
	ref->target = mark;
	ref->pos = writtenSize();
	m_references << ref;

	// Write a dummy placeholder for the reference
	writeDWord (0xBEEFCAFE);

	return ref;
}